

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Emitter.cpp
# Opt level: O3

void __thiscall Corrade::Interconnect::Emitter::disconnectAllSignals(Emitter *this)

{
  Emitter *this_00;
  _Hash_node_base *p_Var1;
  
  this_00 = this;
  for (p_Var1 = (this->_connections)._M_h._M_before_begin._M_nxt; p_Var1 != (_Hash_node_base *)0x0;
      p_Var1 = p_Var1->_M_nxt) {
    disconnectFromReceiver(this_00,(ConnectionData *)(p_Var1 + 3));
  }
  std::
  _Hashtable<Corrade::Interconnect::Implementation::SignalData,_std::pair<const_Corrade::Interconnect::Implementation::SignalData,_Corrade::Interconnect::Implementation::ConnectionData>,_std::allocator<std::pair<const_Corrade::Interconnect::Implementation::SignalData,_Corrade::Interconnect::Implementation::ConnectionData>_>,_std::__detail::_Select1st,_std::equal_to<Corrade::Interconnect::Implementation::SignalData>,_Corrade::Interconnect::Implementation::SignalDataHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
  ::clear((_Hashtable<Corrade::Interconnect::Implementation::SignalData,_std::pair<const_Corrade::Interconnect::Implementation::SignalData,_Corrade::Interconnect::Implementation::ConnectionData>,_std::allocator<std::pair<const_Corrade::Interconnect::Implementation::SignalData,_Corrade::Interconnect::Implementation::ConnectionData>_>,_std::__detail::_Select1st,_std::equal_to<Corrade::Interconnect::Implementation::SignalData>,_Corrade::Interconnect::Implementation::SignalDataHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
           *)this);
  this->_connectionsChanged = true;
  return;
}

Assistant:

void Emitter::disconnectAllSignals() {
    for(auto it = _connections.begin(); it != _connections.end(); ++it)
        disconnectFromReceiver(it->second);

    _connections.clear();
    _connectionsChanged = true;
}